

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_specific.cc
# Opt level: O2

double highwayhash::InvariantTicksPerSecond(void)

{
  uint *puVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  allocator<char> aStack_91;
  double dStack_90;
  undefined1 *puStack_88;
  undefined8 uStack_80;
  undefined1 auStack_78 [4];
  undefined4 auStack_74 [3];
  string sStack_68;
  undefined1 uStack_38;
  
  if ((NominalClockRate()::cycles_per_second == '\0') &&
     (iVar6 = __cxa_guard_acquire(&NominalClockRate()::cycles_per_second), iVar6 != 0)) {
    puVar1 = (uint *)cpuid(0x80000000);
    if (*puVar1 < 0x80000004) {
      puStack_88 = auStack_78;
      uStack_80 = 0;
      auStack_78[0] = 0;
    }
    else {
      iVar6 = -0x7ffffffe;
      for (lVar8 = 0xc; lVar8 != 0x3c; lVar8 = lVar8 + 0x10) {
        if (iVar6 == 0) {
          puVar2 = (undefined4 *)cpuid_basic_info(0);
        }
        else if (iVar6 == 1) {
          puVar2 = (undefined4 *)cpuid_Version_info(1);
        }
        else if (iVar6 == 2) {
          puVar2 = (undefined4 *)cpuid_cache_tlb_info(2);
        }
        else if (iVar6 == 3) {
          puVar2 = (undefined4 *)cpuid_serial_info(3);
        }
        else if (iVar6 == 4) {
          puVar2 = (undefined4 *)cpuid_Deterministic_Cache_Parameters_info(4);
        }
        else if (iVar6 == 5) {
          puVar2 = (undefined4 *)cpuid_MONITOR_MWAIT_Features_info(5);
        }
        else if (iVar6 == 6) {
          puVar2 = (undefined4 *)cpuid_Thermal_Power_Management_info(6);
        }
        else if (iVar6 == 7) {
          puVar2 = (undefined4 *)cpuid_Extended_Feature_Enumeration_info(7);
        }
        else if (iVar6 == 9) {
          puVar2 = (undefined4 *)cpuid_Direct_Cache_Access_info(9);
        }
        else if (iVar6 == 10) {
          puVar2 = (undefined4 *)cpuid_Architectural_Performance_Monitoring_info(10);
        }
        else if (iVar6 == 0xb) {
          puVar2 = (undefined4 *)cpuid_Extended_Topology_info(0xb);
        }
        else if (iVar6 == 0xd) {
          puVar2 = (undefined4 *)cpuid_Processor_Extended_States_info(0xd);
        }
        else if (iVar6 == 0xf) {
          puVar2 = (undefined4 *)cpuid_Quality_of_Service_info(0xf);
        }
        else if (iVar6 == -0x7ffffffe) {
          puVar2 = (undefined4 *)cpuid_brand_part1_info(0x80000002);
        }
        else if (iVar6 == -0x7ffffffd) {
          puVar2 = (undefined4 *)cpuid_brand_part2_info(0x80000003);
        }
        else if (iVar6 == -0x7ffffffc) {
          puVar2 = (undefined4 *)cpuid_brand_part3_info(0x80000004);
        }
        else {
          puVar2 = (undefined4 *)cpuid(iVar6);
        }
        uVar3 = puVar2[1];
        uVar4 = puVar2[2];
        uVar5 = puVar2[3];
        *(undefined4 *)((long)auStack_74 + lVar8) = *puVar2;
        *(undefined4 *)((long)auStack_74 + lVar8 + 4) = uVar3;
        *(undefined4 *)((long)auStack_74 + lVar8 + 8) = uVar5;
        *(undefined4 *)((long)&sStack_68._M_dataplus._M_p + lVar8) = uVar4;
        iVar6 = iVar6 + 1;
      }
      uStack_38 = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&puStack_88,(char *)&sStack_68,&aStack_91);
    }
    pdVar9 = (double *)&DAT_00109680;
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      lVar7 = std::__cxx11::string::find
                        ((char *)&puStack_88,
                         (long)&DAT_00109670 + (long)*(int *)((long)&DAT_00109670 + lVar8));
      if ((lVar7 != -1) &&
         (lVar7 = std::__cxx11::string::rfind((char)&puStack_88,0x20), lVar7 != -1)) {
        std::__cxx11::string::substr((ulong)&sStack_68,(ulong)&puStack_88);
        dStack_90 = std::__cxx11::stod(&sStack_68,(size_t *)0x0);
        dStack_90 = dStack_90 * *pdVar9;
        std::__cxx11::string::~string((string *)&sStack_68);
        goto LAB_00108ea4;
      }
      pdVar9 = pdVar9 + 1;
    }
    dStack_90 = 0.0;
LAB_00108ea4:
    std::__cxx11::string::~string((string *)&puStack_88);
    NominalClockRate::cycles_per_second = dStack_90;
    __cxa_guard_release(&NominalClockRate()::cycles_per_second);
  }
  return NominalClockRate::cycles_per_second;
}

Assistant:

double InvariantTicksPerSecond() {
#if HH_ARCH_PPC
#if __GLIBC__
  static const double cycles_per_second = __ppc_get_timebase_freq();
#elif __FreeBSD__
  double cycles_per_second = 0;
  size_t length = sizeof(cycles_per_second);
  sysctlbyname("kern.timecounter.tc.timebase.frequency", &cycles_per_second,
               &length, NULL, 0);
#elif __OpenBSD__
  /* There is currently no method of retrieving this via userland.
   * This value is correct for Power8 and Power9.
   */
  static const double cycles_per_second = 512000000;
#endif
  return cycles_per_second;
#else
  return NominalClockRate();
#endif
}